

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdp_world.cpp
# Opt level: O0

State * __thiscall despot::POMDPWorld::Initialize(POMDPWorld *this)

{
  DSPOMDP *pDVar1;
  int iVar2;
  undefined4 extraout_var;
  allocator<char> local_31;
  string local_30 [32];
  POMDPWorld *local_10;
  POMDPWorld *this_local;
  
  pDVar1 = this->model_;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"DEFAULT",&local_31);
  iVar2 = (*pDVar1->_vptr_DSPOMDP[8])(pDVar1,local_30);
  (this->super_World).state_ = (State *)CONCAT44(extraout_var,iVar2);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  return (this->super_World).state_;
}

Assistant:

State* POMDPWorld::Initialize() {
	state_ = model_->CreateStartState();
	return state_;
}